

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcAnnotationOccurrence::~IfcAnnotationOccurrence
          (IfcAnnotationOccurrence *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  void *pvVar3;
  
  *(undefined8 *)
   &this[-1].super_IfcStyledItem.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>.
    field_0x18 = 0x833260;
  (this->super_IfcStyledItem).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>.
  _vptr_ObjectHelper = (_func_int **)0x8332b0;
  *(undefined8 *)&this[-1].super_IfcStyledItem.field_0x38 = 0x833288;
  puVar2 = *(undefined1 **)&this[-1].super_IfcStyledItem.field_0x70;
  puVar1 = &this[-1].super_IfcStyledItem.field_0x80;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  pvVar3 = (void *)this[-1].super_IfcStyledItem.Name.ptr.field_2._M_allocated_capacity;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,*(long *)&this[-1].super_IfcStyledItem.Name.have - (long)pvVar3);
  }
  operator_delete(&this[-1].super_IfcStyledItem.
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>.field_0x18,0x98);
  return;
}

Assistant:

IfcAnnotationOccurrence() : Object("IfcAnnotationOccurrence") {}